

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O3

Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *
gimage::operator-=(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,work_t s)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  iVar5 = image->depth;
  if (0 < iVar5) {
    lVar2 = image->height;
    lVar1 = 0;
    do {
      if (0 < lVar2) {
        lVar4 = image->width;
        lVar3 = 0;
        do {
          if (0 < lVar4) {
            lVar2 = 0;
            do {
              iVar5 = (uint)image->img[lVar1][lVar3][lVar2] - s;
              if (0xfe < iVar5) {
                iVar5 = 0xff;
              }
              if (iVar5 < 1) {
                iVar5 = 0;
              }
              image->img[lVar1][lVar3][lVar2] = (uchar)iVar5;
              lVar2 = lVar2 + 1;
              lVar4 = image->width;
            } while (lVar2 < lVar4);
            lVar2 = image->height;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < lVar2);
        iVar5 = image->depth;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < iVar5);
  }
  return image;
}

Assistant:

Image<T> &operator-=(Image<T> &image, typename Image<T>::work_t s)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        T v=0;

        v=image.get(i, k, d);

        if (image.isValidS(v))
        {
          image.setLimited(i, k, d, v-s);
        }
      }
    }
  }

  return image;
}